

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c++
# Opt level: O1

void kj::_::throwDestroyedWhileInList(void)

{
  char (*in_RCX) [45];
  String SStack_1b8;
  Exception local_1a0;
  
  Debug::makeDescription<char_const(&)[45]>
            (&SStack_1b8,(Debug *)"\"destroyed object that is still in a kj::List\"",
             "destroyed object that is still in a kj::List",in_RCX);
  Exception::Exception
            (&local_1a0,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/list.c++"
             ,0x2a,&SStack_1b8);
  throwFatalException(&local_1a0,0);
}

Assistant:

void throwDestroyedWhileInList() {
  kj::throwFatalException(KJ_EXCEPTION(FAILED,
      "destroyed object that is still in a kj::List"));
}